

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Id __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::getSampledType
          (TGlslangToSpvTraverser *this,TSampler *sampler)

{
  TSampler *sampler_local;
  TGlslangToSpvTraverser *this_local;
  
  switch(*(undefined1 *)sampler) {
  case 1:
    this_local._4_4_ = spv::Builder::makeFloatType(&this->builder,0x20);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x1315,
                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::getSampledType(const glslang::TSampler &)"
                 );
  case 3:
    spv::Builder::addExtension(&this->builder,"SPV_AMD_gpu_shader_half_float_fetch");
    spv::Builder::addCapability(&this->builder,CapabilityFloat16ImageAMD);
    this_local._4_4_ = spv::Builder::makeFloatType(&this->builder,0x10);
    break;
  case 8:
    this_local._4_4_ = spv::Builder::makeIntType(&this->builder,0x20);
    break;
  case 9:
    this_local._4_4_ = spv::Builder::makeUintType(&this->builder,0x20);
    break;
  case 10:
    spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_image_int64");
    spv::Builder::addCapability(&this->builder,CapabilityInt64ImageEXT);
    this_local._4_4_ = spv::Builder::makeIntType(&this->builder,0x40);
    break;
  case 0xb:
    spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_image_int64");
    spv::Builder::addCapability(&this->builder,CapabilityInt64ImageEXT);
    this_local._4_4_ = spv::Builder::makeUintType(&this->builder,0x40);
  }
  return this_local._4_4_;
}

Assistant:

spv::Id TGlslangToSpvTraverser::getSampledType(const glslang::TSampler& sampler)
{
    switch (sampler.type) {
        case glslang::EbtInt:      return builder.makeIntType(32);
        case glslang::EbtUint:     return builder.makeUintType(32);
        case glslang::EbtFloat:    return builder.makeFloatType(32);
        case glslang::EbtFloat16:
            builder.addExtension(spv::E_SPV_AMD_gpu_shader_half_float_fetch);
            builder.addCapability(spv::CapabilityFloat16ImageAMD);
            return builder.makeFloatType(16);
        case glslang::EbtInt64:
            builder.addExtension(spv::E_SPV_EXT_shader_image_int64);
            builder.addCapability(spv::CapabilityInt64ImageEXT);
            return builder.makeIntType(64);
        case glslang::EbtUint64:
            builder.addExtension(spv::E_SPV_EXT_shader_image_int64);
            builder.addCapability(spv::CapabilityInt64ImageEXT);
            return builder.makeUintType(64);
        default:
            assert(0);
            return builder.makeFloatType(32);
    }
}